

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_node.cpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::SelectNode::Copy(SelectNode *this)

{
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  pointer ppVar4;
  size_t sVar5;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var6;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var7;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> __p;
  pointer pSVar8;
  pointer pPVar9;
  pointer pTVar10;
  type other;
  pointer *__ptr;
  QueryNode *in_RSI;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *group;
  pointer this_01;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_48;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_40;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_38;
  
  local_38._M_head_impl = &this->super_QueryNode;
  make_uniq<duckdb::SelectNode>();
  puVar1 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             **)&in_RSI[1].type;
  for (this_00 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_RSI[1]._vptr_QueryNode; this_00 != puVar1; this_00 = this_00 + 1) {
    pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
             operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)&stack0xffffffffffffffc0);
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(this_00);
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&stack0xffffffffffffffb8,pPVar9);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar8->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&stack0xffffffffffffffb8);
    if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )local_48._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (in_RSI[1].modifiers.
      super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
    local_48._M_head_impl = (TableRef *)0x0;
  }
  else {
    pTVar10 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                        ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                          *)&in_RSI[1].modifiers.
                             super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
    (*pTVar10->_vptr_TableRef[4])(&stack0xffffffffffffffb8,pTVar10);
  }
  pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&stack0xffffffffffffffc0);
  _Var6._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (TableRef *)0x0;
  _Var2._M_head_impl =
       (pSVar8->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar8->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var6._M_head_impl;
  if (_Var2._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
    if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_48._M_head_impl !=
        (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
      (*(((ParsedExpression *)local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])
                ();
    }
  }
  if (in_RSI[1].modifiers.
      super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    local_48._M_head_impl = (TableRef *)0x0;
  }
  else {
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&in_RSI[1].modifiers.
                              super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&stack0xffffffffffffffb8,pPVar9);
  }
  pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&stack0xffffffffffffffc0);
  _Var7._M_head_impl = (ParsedExpression *)local_48._M_head_impl;
  local_48._M_head_impl = (TableRef *)0x0;
  _Var3._M_head_impl =
       (pSVar8->where_clause).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pSVar8->where_clause).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_48._M_head_impl !=
        (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
      (*(((ParsedExpression *)local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])
                ();
    }
  }
  ppVar4 = in_RSI[1].cte_map.map.map.
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
           .
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = in_RSI[1].cte_map.map.map.
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                 .
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != ppVar4;
      this_01 = (pointer)&(this_01->first)._M_string_length) {
    pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
             operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)&stack0xffffffffffffffc0);
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)this_01);
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&stack0xffffffffffffffb8,pPVar9);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar8->groups,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&stack0xffffffffffffffb8);
    if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )local_48._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&stack0xffffffffffffffc0);
  ::std::
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::operator=(&(pSVar8->groups).grouping_sets.
               super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
              ,(vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                *)&in_RSI[1].cte_map.map.map_idx);
  sVar5 = in_RSI[1].cte_map.map.map_idx._M_h._M_rehash_policy._M_next_resize;
  pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&stack0xffffffffffffffc0);
  pSVar8->aggregate_handling = (AggregateHandling)sVar5;
  if (in_RSI[1].cte_map.map.map_idx._M_h._M_element_count == 0) {
    local_48._M_head_impl = (TableRef *)0x0;
  }
  else {
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&in_RSI[1].cte_map.map.map_idx._M_h._M_element_count);
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&stack0xffffffffffffffb8,pPVar9);
  }
  pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&stack0xffffffffffffffc0);
  _Var7._M_head_impl = (ParsedExpression *)local_48._M_head_impl;
  local_48._M_head_impl = (TableRef *)0x0;
  _Var3._M_head_impl =
       (pSVar8->having).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pSVar8->having).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_48._M_head_impl !=
        (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
      (*(((ParsedExpression *)local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])
                ();
    }
  }
  if (*(long *)&in_RSI[1].cte_map.map.map_idx._M_h._M_rehash_policy == 0) {
    local_48._M_head_impl = (TableRef *)0x0;
  }
  else {
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&in_RSI[1].cte_map.map.map_idx._M_h._M_rehash_policy);
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&stack0xffffffffffffffb8,pPVar9);
  }
  pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&stack0xffffffffffffffc0);
  _Var7._M_head_impl = (ParsedExpression *)local_48._M_head_impl;
  local_48._M_head_impl = (TableRef *)0x0;
  _Var3._M_head_impl =
       (pSVar8->qualify).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pSVar8->qualify).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_48._M_head_impl !=
        (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
      (**(code **)(*(long *)&((Value *)
                             &((ParsedExpression *)local_48._M_head_impl)->super_BaseExpression)->
                             type_ + 8))();
    }
  }
  if (in_RSI[1].cte_map.map.map_idx._M_h._M_single_bucket == (__node_base_ptr)0x0) {
    local_48._M_head_impl = (TableRef *)0x0;
  }
  else {
    unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::operator->
              ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                *)&in_RSI[1].cte_map.map.map_idx._M_h._M_single_bucket);
    SampleOptions::Copy((SampleOptions *)&stack0xffffffffffffffb8);
  }
  pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&stack0xffffffffffffffc0);
  __p._M_t.super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
  ._M_t.super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
  .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true,_true>
        )(__uniq_ptr_data<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true,_true>
          )local_48._M_head_impl;
  local_48._M_head_impl = (TableRef *)0x0;
  ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::reset
            ((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
             &pSVar8->sample,
             (pointer)__p._M_t.
                      super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                      .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::~unique_ptr
            ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
             &stack0xffffffffffffffb8);
  other = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator*
                    ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                      *)&stack0xffffffffffffffc0);
  QueryNode::CopyProperties(in_RSI,&other->super_QueryNode);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_head_impl)->_vptr__Sp_counted_base =
       (_func_int **)local_40._M_head_impl;
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (_Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>)
         local_38._M_head_impl;
}

Assistant:

unique_ptr<QueryNode> SelectNode::Copy() const {
	auto result = make_uniq<SelectNode>();
	for (auto &child : select_list) {
		result->select_list.push_back(child->Copy());
	}
	result->from_table = from_table ? from_table->Copy() : nullptr;
	result->where_clause = where_clause ? where_clause->Copy() : nullptr;
	// groups
	for (auto &group : groups.group_expressions) {
		result->groups.group_expressions.push_back(group->Copy());
	}
	result->groups.grouping_sets = groups.grouping_sets;
	result->aggregate_handling = aggregate_handling;
	result->having = having ? having->Copy() : nullptr;
	result->qualify = qualify ? qualify->Copy() : nullptr;
	result->sample = sample ? sample->Copy() : nullptr;
	this->CopyProperties(*result);
	return std::move(result);
}